

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O3

void UInt8_To_Int24(void *destinationBuffer,int destinationStride,void *sourceBuffer,
                   int sourceStride,uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  char cVar1;
  uchar *dest;
  char *pcVar2;
  
  if (count != 0) {
    pcVar2 = (char *)((long)destinationBuffer + 2);
    do {
      pcVar2[-2] = '\0';
      pcVar2[-1] = '\0';
      cVar1 = *sourceBuffer;
      sourceBuffer = (void *)((long)sourceBuffer + (long)sourceStride);
      *pcVar2 = cVar1 + -0x80;
      pcVar2 = pcVar2 + destinationStride * 3;
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

static void UInt8_To_Int24(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    unsigned char *src  = (unsigned char*)sourceBuffer;
    unsigned char *dest = (unsigned char*)destinationBuffer;
    (void) ditherGenerator; /* unused parameters */

    while( count-- )
    {

#if defined(PA_LITTLE_ENDIAN)
        dest[0] = 0;
        dest[1] = 0;
        dest[2] = (unsigned char)(*src - 128);
#elif defined(PA_BIG_ENDIAN)
        dest[0] = (unsigned char)(*src - 128);
        dest[1] = 0;
        dest[2] = 0;
#endif

        src += sourceStride;
        dest += destinationStride * 3;
    }
}